

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenerators::StartsWith(cmQtAutoGenerators *this,string *str,string *with)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::substr((ulong)&local_30,(ulong)str);
  _Var1 = std::operator==(&local_30,with);
  std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

bool cmQtAutoGenerators::StartsWith(const std::string& str,
                                    const std::string& with)
{
  return (str.substr(0, with.length()) == with);
}